

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

void set_skip_txfm(MACROBLOCK *x,RD_STATS *rd_stats,BLOCK_SIZE bsize,int64_t dist)

{
  byte txsize;
  long lVar1;
  BLOCK_SIZE plane_bsize;
  int iVar2;
  long in_RCX;
  BLOCK_SIZE in_DL;
  int *in_RSI;
  long in_RDI;
  int zero_blk_rate;
  TXB_CTX txb_ctx;
  TX_SIZE txs_ctx;
  ENTROPY_CONTEXT *tl;
  ENTROPY_CONTEXT *ta;
  ENTROPY_CONTEXT ctxl [32];
  ENTROPY_CONTEXT ctxa [32];
  int i;
  TX_SIZE tx_size;
  int n4;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  TXB_CTX *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  TX_SIZE in_stack_ffffffffffffff66;
  BLOCK_SIZE in_stack_ffffffffffffff67;
  int local_3c;
  long local_20;
  
  lVar1 = **(long **)(in_RDI + 0x2058);
  iVar2 = bsize_to_num_blk(in_DL);
  txsize = ""[in_DL];
  memset(*(void **)(in_RDI + 0x2088),0,(long)iVar2);
  memset((void *)(lVar1 + 0x92),(uint)txsize,0x10);
  *(byte *)(lVar1 + 0x91) = txsize;
  for (local_3c = 0; local_3c < iVar2; local_3c = local_3c + 1) {
    set_blk_skip((uint8_t *)(in_RDI + 0x24e09),0,local_3c,1);
  }
  *(undefined1 *)(in_RSI + 8) = 1;
  iVar2 = is_cur_buf_hbd((MACROBLOCKD *)(in_RDI + 0x1a0));
  local_20 = in_RCX;
  if (iVar2 != 0) {
    local_20 = in_RCX + ((1 << (((char)*(undefined4 *)(in_RDI + 0x2b40) + -8) * '\x02' & 0x1fU)) >>
                        1) >> (((char)*(undefined4 *)(in_RDI + 0x2b40) + -8) * '\x02' & 0x3fU);
  }
  *(long *)(in_RSI + 6) = local_20 << 4;
  *(long *)(in_RSI + 2) = local_20 << 4;
  av1_get_entropy_contexts
            (in_stack_ffffffffffffff67,
             (macroblockd_plane *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (ENTROPY_CONTEXT *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (ENTROPY_CONTEXT *)in_stack_ffffffffffffff48);
  plane_bsize = get_txsize_entropy_ctx(txsize);
  get_txb_ctx(plane_bsize,in_stack_ffffffffffffff66,in_stack_ffffffffffffff60,
              (ENTROPY_CONTEXT *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
              (ENTROPY_CONTEXT *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
              in_stack_ffffffffffffff48);
  *in_RSI = *(int *)(in_RDI + (ulong)plane_bsize * 0x1d80 + 0xb9dc +
                    (long)in_stack_ffffffffffffff5c * 8) *
            ((int)(uint)block_size_wide[in_DL] >> ((byte)tx_size_wide_log2[txsize] & 0x1f)) *
            ((int)(uint)block_size_high[in_DL] >> ((byte)tx_size_high_log2[txsize] & 0x1f));
  return;
}

Assistant:

static inline void set_skip_txfm(MACROBLOCK *x, RD_STATS *rd_stats,
                                 BLOCK_SIZE bsize, int64_t dist) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int n4 = bsize_to_num_blk(bsize);
  const TX_SIZE tx_size = max_txsize_rect_lookup[bsize];
  memset(xd->tx_type_map, DCT_DCT, sizeof(xd->tx_type_map[0]) * n4);
  memset(mbmi->inter_tx_size, tx_size, sizeof(mbmi->inter_tx_size));
  mbmi->tx_size = tx_size;
  for (int i = 0; i < n4; ++i)
    set_blk_skip(x->txfm_search_info.blk_skip, 0, i, 1);
  rd_stats->skip_txfm = 1;
  if (is_cur_buf_hbd(xd)) dist = ROUND_POWER_OF_TWO(dist, (xd->bd - 8) * 2);
  rd_stats->dist = rd_stats->sse = (dist << 4);
  // Though decision is to make the block as skip based on luma stats,
  // it is possible that block becomes non skip after chroma rd. In addition
  // intermediate non skip costs calculated by caller function will be
  // incorrect, if rate is set as  zero (i.e., if zero_blk_rate is not
  // accounted). Hence intermediate rate is populated to code the luma tx blks
  // as skip, the caller function based on final rd decision (i.e., skip vs
  // non-skip) sets the final rate accordingly. Here the rate populated
  // corresponds to coding all the tx blocks with zero_blk_rate (based on max tx
  // size possible) in the current block. Eg: For 128*128 block, rate would be
  // 4 * zero_blk_rate where zero_blk_rate corresponds to coding of one 64x64 tx
  // block as 'all zeros'
  ENTROPY_CONTEXT ctxa[MAX_MIB_SIZE];
  ENTROPY_CONTEXT ctxl[MAX_MIB_SIZE];
  av1_get_entropy_contexts(bsize, &xd->plane[0], ctxa, ctxl);
  ENTROPY_CONTEXT *ta = ctxa;
  ENTROPY_CONTEXT *tl = ctxl;
  const TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);
  TXB_CTX txb_ctx;
  get_txb_ctx(bsize, tx_size, 0, ta, tl, &txb_ctx);
  const int zero_blk_rate = x->coeff_costs.coeff_costs[txs_ctx][PLANE_TYPE_Y]
                                .txb_skip_cost[txb_ctx.txb_skip_ctx][1];
  rd_stats->rate = zero_blk_rate *
                   (block_size_wide[bsize] >> tx_size_wide_log2[tx_size]) *
                   (block_size_high[bsize] >> tx_size_high_log2[tx_size]);
}